

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renameResolveTrigger(Parse *pParse)

{
  sqlite3 *db_00;
  Trigger *pTVar1;
  char *zName;
  Db *pDVar2;
  long lVar3;
  SrcList *pSVar4;
  int iVar5;
  Table *pTVar6;
  Select *p_00;
  ExprList *pUpsertSet;
  Upsert *pUpsert;
  SrcItem *p;
  int i;
  Select *pSel;
  SrcList *pSrc;
  undefined1 auStack_60 [4];
  int rc;
  NameContext sNC;
  TriggerStep *pStep;
  Trigger *pNew;
  sqlite3 *db;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  pTVar1 = pParse->pNewTrigger;
  pSrc._4_4_ = 0;
  memset(auStack_60,0,0x38);
  zName = pTVar1->table;
  pDVar2 = db_00->aDb;
  _auStack_60 = pParse;
  iVar5 = sqlite3SchemaToIndex(db_00,pTVar1->pTabSchema);
  pTVar6 = sqlite3FindTable(db_00,zName,pDVar2[iVar5].zDbSName);
  pParse->pTriggerTab = pTVar6;
  pParse->eTriggerOp = pTVar1->op;
  if (pParse->pTriggerTab != (Table *)0x0) {
    pSrc._4_4_ = sqlite3ViewGetColumnNames(pParse,pParse->pTriggerTab);
  }
  if ((pSrc._4_4_ == 0) && (pTVar1->pWhen != (Expr *)0x0)) {
    pSrc._4_4_ = sqlite3ResolveExprNames((NameContext *)auStack_60,pTVar1->pWhen);
  }
  for (sNC.pWinSelect = (Select *)pTVar1->step_list;
      pSrc._4_4_ == 0 && sNC.pWinSelect != (Select *)0x0; sNC.pWinSelect = (sNC.pWinSelect)->pPrior)
  {
    lVar3._0_4_ = (sNC.pWinSelect)->selId;
    lVar3._4_4_ = (sNC.pWinSelect)->addrOpenEphm[0];
    if ((lVar3 != 0) &&
       (sqlite3SelectPrep(pParse,*(Select **)&(sNC.pWinSelect)->selId,(NameContext *)auStack_60),
       pParse->nErr != 0)) {
      pSrc._4_4_ = pParse->rc;
    }
    if ((pSrc._4_4_ == 0) && (*(long *)((sNC.pWinSelect)->addrOpenEphm + 1) != 0)) {
      pSel = (Select *)sqlite3TriggerStepSrc(pParse,(TriggerStep *)sNC.pWinSelect);
      if (pSel == (Select *)0x0) {
        pSrc._4_4_ = 7;
      }
      else {
        p_00 = sqlite3SelectNew(pParse,(ExprList *)(sNC.pWinSelect)->pWhere,(SrcList *)pSel,
                                (Expr *)0x0,(ExprList *)0x0,(Expr *)0x0,(ExprList *)0x0,0,
                                (Expr *)0x0);
        if (p_00 == (Select *)0x0) {
          (sNC.pWinSelect)->pWhere = (Expr *)0x0;
          pSel = (Select *)0x0;
          pSrc._4_4_ = 7;
        }
        else {
          sqlite3SelectPrep(pParse,p_00,(NameContext *)0x0);
          pSrc._4_4_ = (uint)(pParse->nErr != 0);
          if ((sNC.pWinSelect)->pWhere != (Expr *)0x0) {
            p_00->pEList = (ExprList *)0x0;
          }
          p_00->pSrc = (SrcList *)0x0;
          sqlite3SelectDelete(db_00,p_00);
        }
        if ((sNC.pWinSelect)->pEList != (ExprList *)0x0) {
          for (p._4_4_ = 0; p._4_4_ < (sNC.pWinSelect)->pEList->nExpr && pSrc._4_4_ == 0;
              p._4_4_ = p._4_4_ + 1) {
            if (*(long *)((long)(sNC.pWinSelect)->pEList + (long)p._4_4_ * 0x68 + 0x30) != 0) {
              sqlite3SelectPrep(pParse,*(Select **)
                                        ((long)(sNC.pWinSelect)->pEList +
                                        (long)p._4_4_ * 0x68 + 0x30),(NameContext *)0x0);
            }
          }
        }
        if (db_00->mallocFailed != '\0') {
          pSrc._4_4_ = 7;
        }
        sNC.pParse = (Parse *)pSel;
        if ((pSrc._4_4_ == 0) && ((sNC.pWinSelect)->pSrc != (SrcList *)0x0)) {
          pSrc._4_4_ = sqlite3ResolveExprNames
                                 ((NameContext *)auStack_60,(Expr *)(sNC.pWinSelect)->pSrc);
        }
        if (pSrc._4_4_ == 0) {
          pSrc._4_4_ = sqlite3ResolveExprListNames
                                 ((NameContext *)auStack_60,(ExprList *)(sNC.pWinSelect)->pWhere);
        }
        if (((sNC.pWinSelect)->pHaving != (Expr *)0x0) && (pSrc._4_4_ == 0)) {
          pSVar4 = (SrcList *)(sNC.pWinSelect)->pHaving;
          *(Select **)&pSVar4->a[0].regResult = pSel;
          sNC.nRef = 0x200;
          sNC.pSrcList = pSVar4;
          pSrc._4_4_ = sqlite3ResolveExprListNames((NameContext *)auStack_60,*(ExprList **)pSVar4);
          if (pSrc._4_4_ == 0) {
            pSrc._4_4_ = sqlite3ResolveExprListNames
                                   ((NameContext *)auStack_60,(ExprList *)pSVar4->a[0].zDatabase);
          }
          if (pSrc._4_4_ == 0) {
            pSrc._4_4_ = sqlite3ResolveExprNames
                                   ((NameContext *)auStack_60,(Expr *)pSVar4->a[0].zName);
          }
          if (pSrc._4_4_ == 0) {
            pSrc._4_4_ = sqlite3ResolveExprNames
                                   ((NameContext *)auStack_60,(Expr *)pSVar4->a[0].pSchema);
          }
          sNC.nRef = 0;
        }
        sNC.pParse = (Parse *)0x0;
        sqlite3SrcListDelete(db_00,(SrcList *)pSel);
      }
    }
  }
  return pSrc._4_4_;
}

Assistant:

static int renameResolveTrigger(Parse *pParse){
  sqlite3 *db = pParse->db;
  Trigger *pNew = pParse->pNewTrigger;
  TriggerStep *pStep;
  NameContext sNC;
  int rc = SQLITE_OK;

  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  assert( pNew->pTabSchema );
  pParse->pTriggerTab = sqlite3FindTable(db, pNew->table,
      db->aDb[sqlite3SchemaToIndex(db, pNew->pTabSchema)].zDbSName
  );
  pParse->eTriggerOp = pNew->op;
  /* ALWAYS() because if the table of the trigger does not exist, the
  ** error would have been hit before this point */
  if( ALWAYS(pParse->pTriggerTab) ){
    rc = sqlite3ViewGetColumnNames(pParse, pParse->pTriggerTab);
  }

  /* Resolve symbols in WHEN clause */
  if( rc==SQLITE_OK && pNew->pWhen ){
    rc = sqlite3ResolveExprNames(&sNC, pNew->pWhen);
  }

  for(pStep=pNew->step_list; rc==SQLITE_OK && pStep; pStep=pStep->pNext){
    if( pStep->pSelect ){
      sqlite3SelectPrep(pParse, pStep->pSelect, &sNC);
      if( pParse->nErr ) rc = pParse->rc;
    }
    if( rc==SQLITE_OK && pStep->zTarget ){
      SrcList *pSrc = sqlite3TriggerStepSrc(pParse, pStep);
      if( pSrc ){
        Select *pSel = sqlite3SelectNew(
            pParse, pStep->pExprList, pSrc, 0, 0, 0, 0, 0, 0
        );
        if( pSel==0 ){
          pStep->pExprList = 0;
          pSrc = 0;
          rc = SQLITE_NOMEM;
        }else{
          sqlite3SelectPrep(pParse, pSel, 0);
          rc = pParse->nErr ? SQLITE_ERROR : SQLITE_OK;
          assert( pStep->pExprList==0 || pStep->pExprList==pSel->pEList );
          assert( pSrc==pSel->pSrc );
          if( pStep->pExprList ) pSel->pEList = 0;
          pSel->pSrc = 0;
          sqlite3SelectDelete(db, pSel);
        }
        if( pStep->pFrom ){
          int i;
          for(i=0; i<pStep->pFrom->nSrc && rc==SQLITE_OK; i++){
            SrcItem *p = &pStep->pFrom->a[i];
            if( p->pSelect ){
              sqlite3SelectPrep(pParse, p->pSelect, 0);
            }
          }
        }

        if(  db->mallocFailed ){
          rc = SQLITE_NOMEM;
        }
        sNC.pSrcList = pSrc;
        if( rc==SQLITE_OK && pStep->pWhere ){
          rc = sqlite3ResolveExprNames(&sNC, pStep->pWhere);
        }
        if( rc==SQLITE_OK ){
          rc = sqlite3ResolveExprListNames(&sNC, pStep->pExprList);
        }
        assert( !pStep->pUpsert || (!pStep->pWhere && !pStep->pExprList) );
        if( pStep->pUpsert && rc==SQLITE_OK ){
          Upsert *pUpsert = pStep->pUpsert;
          pUpsert->pUpsertSrc = pSrc;
          sNC.uNC.pUpsert = pUpsert;
          sNC.ncFlags = NC_UUpsert;
          rc = sqlite3ResolveExprListNames(&sNC, pUpsert->pUpsertTarget);
          if( rc==SQLITE_OK ){
            ExprList *pUpsertSet = pUpsert->pUpsertSet;
            rc = sqlite3ResolveExprListNames(&sNC, pUpsertSet);
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3ResolveExprNames(&sNC, pUpsert->pUpsertWhere);
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3ResolveExprNames(&sNC, pUpsert->pUpsertTargetWhere);
          }
          sNC.ncFlags = 0;
        }
        sNC.pSrcList = 0;
        sqlite3SrcListDelete(db, pSrc);
      }else{
        rc = SQLITE_NOMEM;
      }
    }
  }
  return rc;
}